

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O2

void m_initgrp(monst *mtmp,level *lev,int x,int y,int n)

{
  byte bVar1;
  boolean bVar2;
  uint uVar3;
  undefined8 in_RAX;
  monst *mtmp_00;
  sbyte sVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  undefined6 uStack_38;
  coord mm;
  
  _uStack_38 = in_RAX;
  bVar1 = level_difficulty(&lev->z);
  uVar3 = rnd(n);
  uVar6 = uVar3;
  if ('\0' < (char)bVar1) {
    uVar5 = 4;
    if (2 < bVar1) {
      uVar5 = (bVar1 < 5) + 1;
    }
    sVar4 = 2;
    if (2 < bVar1) {
      sVar4 = bVar1 < 5;
    }
    uVar6 = 1;
    if (uVar5 <= uVar3) {
      uVar6 = uVar3 >> sVar4;
    }
  }
  _uStack_38 = CONCAT17((char)y,CONCAT16((char)x,uStack_38));
  while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
    bVar2 = peace_minded(mtmp->data);
    if (bVar2 == '\0') {
      bVar2 = enexto(&mm,lev,mm.x,mm.y,mtmp->data);
      if (bVar2 != '\0') {
        mtmp_00 = makemon(mtmp->data,lev,(int)mm.x,(int)mm.y,0);
        if (mtmp_00 != (monst *)0x0) {
          *(uint *)&mtmp_00->field_0x60 = *(uint *)&mtmp_00->field_0x60 & 0xffbf7fff;
          set_malign(mtmp_00);
        }
      }
    }
  }
  return;
}

Assistant:

static void m_initgrp(struct monst *mtmp, struct level *lev, int x, int y, int n)
{
	coord mm;
	int dl = level_difficulty(&lev->z);
	int cnt = rnd(n);
	struct monst *mon;

	/* Tuning: cut down on swarming at shallow depths */
	if (dl > 0) {
	    cnt /= (dl < 3) ? 4 : (dl < 5) ? 2 : 1;
	    if (!cnt) cnt++;
	}

	mm.x = x;
	mm.y = y;
	while (cnt--) {
		if (peace_minded(mtmp->data)) continue;
		/* Don't create groups of peaceful monsters since they'll get
		 * in our way.  If the monster has a percentage chance so some
		 * are peaceful and some are not, the result will just be a
		 * smaller group.
		 */
		if (enexto(&mm, lev, mm.x, mm.y, mtmp->data)) {
		    mon = makemon(mtmp->data, lev, mm.x, mm.y, NO_MM_FLAGS);
		    if (mon) {
			mon->mpeaceful = FALSE;
			mon->mavenge = 0;
			set_malign(mon);
			/* Undo the second peace_minded() check in makemon();
			 * if the monster turned out to be peaceful the first
			 * time we didn't create it at all; we don't want a
			 * second check.
			 */
		    }
		}
	}
}